

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

_Bool av1_resize_and_extend_frame_nonnormative
                (YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst,int bd,int num_planes)

{
  _Bool _Var1;
  int in_ECX;
  int in_EDX;
  uint8_t *in_RSI;
  long in_RDI;
  uint8_t *unaff_retaddr;
  int in_stack_00000010;
  int in_stack_00000018;
  int is_uv;
  int i;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_30;
  int local_24;
  int in_stride;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  local_24 = 0;
  while( true ) {
    local_30 = in_ECX;
    if (2 < in_ECX) {
      local_30 = 3;
    }
    if (local_30 <= local_24) break;
    in_stride = (int)((ulong)in_RDI >> 0x20);
    if ((*(uint *)(in_RDI + 0xc0) & 8) == 0) {
      in_stack_ffffffffffffffc0 =
           *(undefined4 *)(in_RSI + (long)(int)(uint)(0 < local_24) * 4 + 0x20);
      _Var1 = av1_resize_plane(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,
                               in_stride,in_RSI,in_EDX,in_stack_00000010,in_stack_00000018);
      if (!_Var1) {
        return false;
      }
    }
    else {
      in_stack_ffffffffffffffc0 =
           *(undefined4 *)(in_RSI + (long)(int)(uint)(0 < local_24) * 4 + 0x20);
      highbd_resize_plane(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,
                          in_stride,in_RSI,in_EDX,in_stack_00000010,in_stack_00000018,is_uv);
    }
    local_24 = local_24 + 1;
  }
  aom_extend_frame_borders_c
            ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
  return true;
}

Assistant:

bool av1_resize_and_extend_frame_nonnormative(const YV12_BUFFER_CONFIG *src,
                                              YV12_BUFFER_CONFIG *dst, int bd,
                                              int num_planes) {
  // TODO(dkovalev): replace YV12_BUFFER_CONFIG with aom_image_t

  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
    const int is_uv = i > 0;
#if CONFIG_AV1_HIGHBITDEPTH
    if (src->flags & YV12_FLAG_HIGHBITDEPTH) {
      highbd_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                          src->crop_widths[is_uv], src->strides[is_uv],
                          dst->buffers[i], dst->crop_heights[is_uv],
                          dst->crop_widths[is_uv], dst->strides[is_uv], bd);
    } else if (!av1_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                                 src->crop_widths[is_uv], src->strides[is_uv],
                                 dst->buffers[i], dst->crop_heights[is_uv],
                                 dst->crop_widths[is_uv],
                                 dst->strides[is_uv])) {
      return false;
    }
#else
    (void)bd;
    if (!av1_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                          src->crop_widths[is_uv], src->strides[is_uv],
                          dst->buffers[i], dst->crop_heights[is_uv],
                          dst->crop_widths[is_uv], dst->strides[is_uv]))
      return false;
#endif
  }
  aom_extend_frame_borders(dst, num_planes);
  return true;
}